

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

void validate_symmetric_distances(Instance *instance)

{
  int iVar1;
  int i;
  int j;
  double dVar2;
  double dVar3;
  
  iVar1 = instance->num_customers;
  i = 0;
  do {
    if (iVar1 < i) {
      return;
    }
    j = 0;
    while (iVar1 + 1 != j) {
      dVar2 = cptp_dist(instance,i,j);
      dVar3 = cptp_dist(instance,j,i);
      j = j + 1;
      if (1e-05 < ABS(dVar2 - dVar3)) {
        __assert_fail("feq(d1, d2, 1e-5)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x24,"void validate_symmetric_distances(const Instance *)");
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void validate_symmetric_distances(const Instance *instance) {
#ifndef NDEBUG
    const int32_t n = instance->num_customers + 1;

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            double d1 = cptp_dist(instance, i, j);
            double d2 = cptp_dist(instance, j, i);
            assert(feq(d1, d2, 1e-5));
        }
    }
#else
    UNUSED_PARAM(instance);
#endif
}